

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbconnection.cpp
# Opt level: O0

xcb_window_t __thiscall QXcbConnection::qtSelectionOwner(QXcbConnection *this)

{
  long lVar1;
  xcb_window_t xVar2;
  QXcbVirtualDesktop *this_00;
  xcb_screen_t *pxVar3;
  xcb_connection_t *pxVar4;
  QXcbConnection *title;
  QXcbConnection *in_RDI;
  undefined4 uVar5;
  undefined4 uVar6;
  long in_FS_OFFSET;
  uint16_t h;
  uint16_t w;
  int16_t y;
  int16_t x;
  xcb_screen_t *xcbScreen;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->m_qtSelectionOwner == 0) {
    this_00 = primaryVirtualDesktop
                        ((QXcbConnection *)
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    pxVar3 = QXcbVirtualDesktop::screen(this_00);
    pxVar4 = QXcbBasicConnection::xcb_connection((QXcbBasicConnection *)in_RDI);
    xVar2 = xcb_generate_id(pxVar4);
    in_RDI->m_qtSelectionOwner = xVar2;
    pxVar4 = QXcbBasicConnection::xcb_connection((QXcbBasicConnection *)in_RDI);
    uVar6 = 3;
    uVar5 = 3;
    uVar7 = 0;
    xcb_create_window(pxVar4,0,in_RDI->m_qtSelectionOwner,pxVar3->root,0,0);
    title = connection((QXcbConnection *)in_RDI);
    xVar2 = in_RDI->m_qtSelectionOwner;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_ffffffffffffff1c,uVar7),
               CONCAT44(in_stack_ffffffffffffff14,uVar5));
    QCoreApplication::applicationName();
    ::operator+((QLatin1String *)CONCAT44(in_stack_ffffffffffffff1c,uVar7),
                (QString *)CONCAT44(in_stack_ffffffffffffff14,uVar5));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QLatin1String,_QString> *)CONCAT44(in_stack_ffffffffffffff0c,uVar6));
    QXcbWindow::setWindowTitle(in_RDI,xVar2,(QString *)title);
    QString::~QString((QString *)0x15d182);
    QStringBuilder<QLatin1String,_QString>::~QStringBuilder
              ((QStringBuilder<QLatin1String,_QString> *)0x15d18f);
    QString::~QString((QString *)0x15d19c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI->m_qtSelectionOwner;
  }
  __stack_chk_fail();
}

Assistant:

xcb_window_t QXcbConnection::qtSelectionOwner()
{
    if (!m_qtSelectionOwner) {
        xcb_screen_t *xcbScreen = primaryVirtualDesktop()->screen();
        int16_t x = 0, y = 0;
        uint16_t w = 3, h = 3;
        m_qtSelectionOwner = xcb_generate_id(xcb_connection());
        xcb_create_window(xcb_connection(),
                          XCB_COPY_FROM_PARENT,               // depth -- same as root
                          m_qtSelectionOwner,                 // window id
                          xcbScreen->root,                    // parent window id
                          x, y, w, h,
                          0,                                  // border width
                          XCB_WINDOW_CLASS_INPUT_OUTPUT,      // window class
                          xcbScreen->root_visual,             // visual
                          0,                                  // value mask
                          nullptr);                           // value list

        QXcbWindow::setWindowTitle(connection(), m_qtSelectionOwner,
                                   "Qt Selection Owner for "_L1 + QCoreApplication::applicationName());
    }
    return m_qtSelectionOwner;
}